

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O1

UBool uhash_compareChars_63(UHashTok key1,UHashTok key2)

{
  char cVar1;
  char *p1;
  char *pcVar2;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    return '\0';
  }
  cVar1 = *key1.pointer;
  if (cVar1 != '\0') {
    pcVar2 = (char *)((long)key1.pointer + 1);
    do {
      if (cVar1 != *key2.pointer) break;
      key2.pointer = key2.pointer + 1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return cVar1 == *key2.pointer;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareChars(const UHashTok key1, const UHashTok key2) {
    const char *p1 = (const char*) key1.pointer;
    const char *p2 = (const char*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && *p1 == *p2) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}